

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X86Disassembler.c
# Opt level: O0

_Bool translateSrcIndex(MCInst *mcInst,InternalInstruction *insn)

{
  uint local_1c;
  uint baseRegNo;
  InternalInstruction *insn_local;
  MCInst *mcInst_local;
  
  if (insn->mode == MODE_64BIT) {
    local_1c = 0x2b;
    if (insn->prefixPresent[0x67] != '\0') {
      local_1c = 0x1d;
    }
  }
  else if (insn->mode == MODE_32BIT) {
    local_1c = 0x1d;
    if (insn->prefixPresent[0x67] != '\0') {
      local_1c = 0x2d;
    }
  }
  else {
    local_1c = 0x2d;
    if (insn->prefixPresent[0x67] != '\0') {
      local_1c = 0x1d;
    }
  }
  MCOperand_CreateReg0(mcInst,local_1c);
  MCOperand_CreateReg0(mcInst,(uint)""[insn->segmentOverride]);
  return false;
}

Assistant:

static bool translateSrcIndex(MCInst *mcInst, InternalInstruction *insn)
{
	unsigned baseRegNo;

	if (insn->mode == MODE_64BIT)
		baseRegNo = insn->prefixPresent[0x67] ? X86_ESI : X86_RSI;
	else if (insn->mode == MODE_32BIT)
		baseRegNo = insn->prefixPresent[0x67] ? X86_SI : X86_ESI;
	else {
		// assert(insn->mode == MODE_16BIT);
		baseRegNo = insn->prefixPresent[0x67] ? X86_ESI : X86_SI;
	}

	MCOperand_CreateReg0(mcInst, baseRegNo);

	MCOperand_CreateReg0(mcInst, segmentRegnums[insn->segmentOverride]);

	return false;
}